

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

char * ReplaceDefine(char *lp)

{
  bool bVar1;
  int local_1c;
  int defineReplaceRecursion;
  char *lp_local;
  
  bVar1 = ReplaceDefineInternal(lp,sline);
  if (bVar1) {
    local_1c = 0;
    do {
      if (9 < local_1c) {
        Error("Unable to finish substitions, line after 20th iteration",sline,SUPPRESS);
        lp_local = sline;
        return lp_local;
      }
      bVar1 = ReplaceDefineInternal(sline,sline2);
      if (!bVar1) {
        lp_local = sline2;
        return lp_local;
      }
      bVar1 = ReplaceDefineInternal(sline2,sline);
      local_1c = local_1c + 1;
    } while (bVar1);
  }
  lp_local = sline;
  return lp_local;
}

Assistant:

char* ReplaceDefine(char* lp) {
	// do first replacement into sline buffer (and if no define replace done, just return it)
	if (!ReplaceDefineInternal(lp, sline)) return sline;
	// Some define were replaced, line is in "sline", now ping-pong it between sline and sline2
	int defineReplaceRecursion = 0;
	while (defineReplaceRecursion++ < 10) {
		if (!ReplaceDefineInternal(sline, sline2)) return sline2;
		if (!ReplaceDefineInternal(sline2, sline)) return sline;
	}
	Error("Unable to finish substitions, line after 20th iteration", sline, SUPPRESS);
	return sline;
}